

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkUtil.c
# Opt level: O0

void Nwk_ManPrintFanioNew(Nwk_Man_t *pNtk)

{
  int iVar1;
  int iVar2;
  int i_00;
  Nwk_Obj_t *pNVar3;
  Vec_Int_t *p;
  Vec_Int_t *p_00;
  double dVar4;
  double dVar5;
  uint local_b0;
  int nSizeMax;
  int k;
  int i;
  int nFanoutsAll;
  int nFaninsAll;
  int nFanoutsMax;
  int nFaninsMax;
  int nFanouts;
  int nFanins;
  Vec_Int_t *vFanouts;
  Vec_Int_t *vFanins;
  Nwk_Obj_t *pNode;
  char Buffer [100];
  Nwk_Man_t *pNtk_local;
  
  nFanoutsAll = 0;
  nFaninsAll = 0;
  k = 0;
  i = 0;
  unique0x1000059e = pNtk;
  for (nSizeMax = 0; iVar1 = Vec_PtrSize(stack0xfffffffffffffff0->vObjs), nSizeMax < iVar1;
      nSizeMax = nSizeMax + 1) {
    pNVar3 = (Nwk_Obj_t *)Vec_PtrEntry(stack0xfffffffffffffff0->vObjs,nSizeMax);
    if ((pNVar3 != (Nwk_Obj_t *)0x0) && (iVar1 = Nwk_ObjIsNode(pNVar3), iVar1 != 0)) {
      iVar1 = Nwk_ObjFaninNum(pNVar3);
      iVar2 = Nwk_ObjFanoutNum(pNVar3);
      i = iVar1 + i;
      k = iVar2 + k;
      nFaninsAll = Abc_MaxInt(nFaninsAll,iVar1);
      nFanoutsAll = Abc_MaxInt(nFanoutsAll,iVar2);
    }
  }
  iVar1 = Abc_Base10Log(nFaninsAll);
  iVar2 = Abc_Base10Log(nFanoutsAll);
  iVar1 = Abc_MaxInt((iVar1 + 1) * 10,(iVar2 + 1) * 10);
  p = Vec_IntStart(iVar1);
  p_00 = Vec_IntStart(iVar1);
  for (nSizeMax = 0; iVar2 = Vec_PtrSize(stack0xfffffffffffffff0->vObjs), nSizeMax < iVar2;
      nSizeMax = nSizeMax + 1) {
    pNVar3 = (Nwk_Obj_t *)Vec_PtrEntry(stack0xfffffffffffffff0->vObjs,nSizeMax);
    if ((pNVar3 != (Nwk_Obj_t *)0x0) && (iVar2 = Nwk_ObjIsNode(pNVar3), iVar2 != 0)) {
      iVar2 = Nwk_ObjFaninNum(pNVar3);
      i_00 = Nwk_ObjFanoutNum(pNVar3);
      if (iVar2 < 10) {
        Vec_IntAddToEntry(p,iVar2,1);
      }
      else if (iVar2 < 100) {
        Vec_IntAddToEntry(p,iVar2 / 10 + 10,1);
      }
      else if (iVar2 < 1000) {
        Vec_IntAddToEntry(p,iVar2 / 100 + 0x14,1);
      }
      else if (iVar2 < 10000) {
        Vec_IntAddToEntry(p,iVar2 / 1000 + 0x1e,1);
      }
      else if (iVar2 < 100000) {
        Vec_IntAddToEntry(p,iVar2 / 10000 + 0x28,1);
      }
      else if (iVar2 < 1000000) {
        Vec_IntAddToEntry(p,iVar2 / 100000 + 0x32,1);
      }
      else if (iVar2 < 10000000) {
        Vec_IntAddToEntry(p,iVar2 / 1000000 + 0x3c,1);
      }
      if (i_00 < 10) {
        Vec_IntAddToEntry(p_00,i_00,1);
      }
      else if (i_00 < 100) {
        Vec_IntAddToEntry(p_00,i_00 / 10 + 10,1);
      }
      else if (i_00 < 1000) {
        Vec_IntAddToEntry(p_00,i_00 / 100 + 0x14,1);
      }
      else if (i_00 < 10000) {
        Vec_IntAddToEntry(p_00,i_00 / 1000 + 0x1e,1);
      }
      else if (i_00 < 100000) {
        Vec_IntAddToEntry(p_00,i_00 / 10000 + 0x28,1);
      }
      else if (i_00 < 1000000) {
        Vec_IntAddToEntry(p_00,i_00 / 100000 + 0x32,1);
      }
      else if (i_00 < 10000000) {
        Vec_IntAddToEntry(p_00,i_00 / 1000000 + 0x3c,1);
      }
    }
  }
  printf("The distribution of fanins and fanouts in the network:\n");
  printf("         Number   Nodes with fanin  Nodes with fanout\n");
  for (local_b0 = 0; (int)local_b0 < iVar1; local_b0 = local_b0 + 1) {
    if ((p->pArray[(int)local_b0] != 0) || (p_00->pArray[(int)local_b0] != 0)) {
      if ((int)local_b0 < 10) {
        printf("%15d : ",(ulong)local_b0);
      }
      else {
        dVar4 = pow(10.0,(double)((int)local_b0 / 10));
        dVar5 = pow(10.0,(double)((int)local_b0 / 10));
        sprintf((char *)&pNode,"%d - %d",(ulong)(uint)((int)dVar4 * ((int)local_b0 % 10)),
                (ulong)((int)dVar5 * ((int)local_b0 % 10 + 1) - 1));
        printf("%15s : ",&pNode);
      }
      if (p->pArray[(int)local_b0] == 0) {
        printf("              ");
      }
      else {
        printf("%12d  ",(ulong)(uint)p->pArray[(int)local_b0]);
      }
      printf("    ");
      if (p_00->pArray[(int)local_b0] == 0) {
        printf("              ");
      }
      else {
        printf("%12d  ",(ulong)(uint)p_00->pArray[(int)local_b0]);
      }
      printf("\n");
    }
  }
  Vec_IntFree(p);
  Vec_IntFree(p_00);
  iVar1 = Nwk_ManNodeNum(stack0xfffffffffffffff0);
  iVar2 = Nwk_ManNodeNum(stack0xfffffffffffffff0);
  printf("Fanins: Max = %d. Ave = %.2f.  Fanouts: Max = %d. Ave =  %.2f.\n",
         ((double)i * 1.0) / (double)iVar1,((double)k * 1.0) / (double)iVar2,(ulong)(uint)nFaninsAll
         ,(ulong)(uint)nFanoutsAll);
  return;
}

Assistant:

void Nwk_ManPrintFanioNew( Nwk_Man_t * pNtk )
{
    char Buffer[100];
    Nwk_Obj_t * pNode;
    Vec_Int_t * vFanins, * vFanouts;
    int nFanins, nFanouts, nFaninsMax, nFanoutsMax, nFaninsAll, nFanoutsAll;
    int i, k, nSizeMax;

    // determine the largest fanin and fanout
    nFaninsMax = nFanoutsMax = 0;
    nFaninsAll = nFanoutsAll = 0;
    Nwk_ManForEachNode( pNtk, pNode, i )
    {
        nFanins  = Nwk_ObjFaninNum(pNode);
        nFanouts = Nwk_ObjFanoutNum(pNode);
        nFaninsAll  += nFanins;
        nFanoutsAll += nFanouts;
        nFaninsMax   = Abc_MaxInt( nFaninsMax, nFanins );
        nFanoutsMax  = Abc_MaxInt( nFanoutsMax, nFanouts );
    }

    // allocate storage for fanin/fanout numbers
    nSizeMax = Abc_MaxInt( 10 * (Abc_Base10Log(nFaninsMax) + 1), 10 * (Abc_Base10Log(nFanoutsMax) + 1) );
    vFanins  = Vec_IntStart( nSizeMax );
    vFanouts = Vec_IntStart( nSizeMax );

    // count the number of fanins and fanouts
    Nwk_ManForEachNode( pNtk, pNode, i )
    {
        nFanins  = Nwk_ObjFaninNum(pNode);
        nFanouts = Nwk_ObjFanoutNum(pNode);
//        nFanouts = Nwk_NodeMffcSize(pNode);

        if ( nFanins < 10 )
            Vec_IntAddToEntry( vFanins, nFanins, 1 );
        else if ( nFanins < 100 )
            Vec_IntAddToEntry( vFanins, 10 + nFanins/10, 1 );
        else if ( nFanins < 1000 )
            Vec_IntAddToEntry( vFanins, 20 + nFanins/100, 1 );
        else if ( nFanins < 10000 )
            Vec_IntAddToEntry( vFanins, 30 + nFanins/1000, 1 );
        else if ( nFanins < 100000 )
            Vec_IntAddToEntry( vFanins, 40 + nFanins/10000, 1 );
        else if ( nFanins < 1000000 )
            Vec_IntAddToEntry( vFanins, 50 + nFanins/100000, 1 );
        else if ( nFanins < 10000000 )
            Vec_IntAddToEntry( vFanins, 60 + nFanins/1000000, 1 );

        if ( nFanouts < 10 )
            Vec_IntAddToEntry( vFanouts, nFanouts, 1 );
        else if ( nFanouts < 100 )
            Vec_IntAddToEntry( vFanouts, 10 + nFanouts/10, 1 );
        else if ( nFanouts < 1000 )
            Vec_IntAddToEntry( vFanouts, 20 + nFanouts/100, 1 );
        else if ( nFanouts < 10000 )
            Vec_IntAddToEntry( vFanouts, 30 + nFanouts/1000, 1 );
        else if ( nFanouts < 100000 )
            Vec_IntAddToEntry( vFanouts, 40 + nFanouts/10000, 1 );
        else if ( nFanouts < 1000000 )
            Vec_IntAddToEntry( vFanouts, 50 + nFanouts/100000, 1 );
        else if ( nFanouts < 10000000 )
            Vec_IntAddToEntry( vFanouts, 60 + nFanouts/1000000, 1 );
    }

    printf( "The distribution of fanins and fanouts in the network:\n" );
    printf( "         Number   Nodes with fanin  Nodes with fanout\n" );
    for ( k = 0; k < nSizeMax; k++ )
    {
        if ( vFanins->pArray[k] == 0 && vFanouts->pArray[k] == 0 )
            continue;
        if ( k < 10 )
            printf( "%15d : ", k );
        else
        {
            sprintf( Buffer, "%d - %d", (int)pow((double)10, k/10) * (k%10), (int)pow((double)10, k/10) * (k%10+1) - 1 ); 
            printf( "%15s : ", Buffer );
        }
        if ( vFanins->pArray[k] == 0 )
            printf( "              " );
        else
            printf( "%12d  ", vFanins->pArray[k] );
        printf( "    " );
        if ( vFanouts->pArray[k] == 0 )
            printf( "              " );
        else
            printf( "%12d  ", vFanouts->pArray[k] );
        printf( "\n" );
    }
    Vec_IntFree( vFanins );
    Vec_IntFree( vFanouts );

    printf( "Fanins: Max = %d. Ave = %.2f.  Fanouts: Max = %d. Ave =  %.2f.\n", 
        nFaninsMax,  1.0*nFaninsAll/Nwk_ManNodeNum(pNtk), 
        nFanoutsMax, 1.0*nFanoutsAll/Nwk_ManNodeNum(pNtk)  );
}